

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O1

void __thiscall Bstrlib::CBString::CBString(CBString *this,char *s)

{
  size_t sVar1;
  uchar *__dest;
  CBStringException *pCVar2;
  uint uVar3;
  CBStringException bstr__cppwrapper_exception;
  string local_80;
  string local_60;
  CBStringException local_40;
  
  this->_vptr_CBString = (_func_int **)&PTR__CBString_001a9830;
  if (s != (char *)0x0) {
    sVar1 = strlen(s);
    if (0x7ffffffe < sVar1) {
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_60,"CBString::Failure in (char *) constructor, string too large",
                 "");
      CBStringException::CBStringException(&local_40,&local_60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p);
      }
      pCVar2 = (CBStringException *)__cxa_allocate_exception(0x28);
      CBStringException::CBStringException(pCVar2,&local_40);
      __cxa_throw(pCVar2,&CBStringException::typeinfo,CBStringException::~CBStringException);
    }
    (this->super_tagbstring).slen = (int)sVar1;
    uVar3 = (int)sVar1 + 1;
    (this->super_tagbstring).mlen = uVar3;
    __dest = (uchar *)malloc((ulong)uVar3);
    (this->super_tagbstring).data = __dest;
    if (__dest != (uchar *)0x0) {
      memcpy(__dest,s,(ulong)uVar3);
      return;
    }
  }
  (this->super_tagbstring).data = (uchar *)0x0;
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_80,"CBString::Failure in (char *) constructor","");
  CBStringException::CBStringException(&local_40,&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  pCVar2 = (CBStringException *)__cxa_allocate_exception(0x28);
  CBStringException::CBStringException(pCVar2,&local_40);
  __cxa_throw(pCVar2,&CBStringException::typeinfo,CBStringException::~CBStringException);
}

Assistant:

CBString::CBString (const char *s) {
	if (s) {
		size_t sslen = strlen (s);
		if (sslen >= INT_MAX) bstringThrow ("Failure in (char *) constructor, string too large")
		slen = (int) sslen;
		mlen = slen + 1;
		if (NULL != (data = (unsigned char *) bstr__alloc (mlen))) {
			bstr__memcpy (data, s, mlen);
			return;
		}
	}
	data = NULL;
	bstringThrow ("Failure in (char *) constructor");
}